

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetRootValueNoFastPath_Var
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  DynamicObject *object;
  Var pvVar1;
  
  object = VarTo<Js::DynamicObject>(instance);
  pvVar1 = PatchGetRootValueNoFastPath(functionBody,inlineCache,inlineCacheIndex,object,propertyId);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueNoFastPath_Var(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        return
            PatchGetRootValueNoFastPath(
                functionBody,
                inlineCache,
                inlineCacheIndex,
                VarTo<DynamicObject>(instance),
                propertyId);
    }